

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_mul_v_s256_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  uint w;
  int iVar5;
  ulong uVar6;
  block_t *Ablock;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  
  auVar13 = ZEXT1664((undefined1  [16])0x0);
  iVar5 = 2;
  auVar14._8_8_ = 0x8080808003020100;
  auVar14._0_8_ = 0x8080808003020100;
  auVar1 = vpmovsxbq_avx(ZEXT216(0x3c3d));
  auVar2 = vpmovsxbq_avx(ZEXT216(0x3a3b));
  auVar3 = vpmovsxbq_avx(ZEXT216(0x3839));
  auVar15 = ZEXT1664((undefined1  [16])0x0);
  do {
    uVar6 = v->w64[0];
    lVar7 = 0;
    do {
      auVar8 = vpbroadcastq_avx512vl();
      auVar9 = vpshufb_avx(ZEXT416((uint)uVar6 & 1),auVar14);
      auVar10 = vpsubq_avx((undefined1  [16])0x0,auVar9);
      auVar9 = vpsraq_avx512vl(auVar8,0x3f);
      auVar9 = vpshufd_avx(auVar9,0xee);
      auVar11._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar10;
      auVar11._16_16_ = ZEXT116(1) * auVar9;
      auVar10 = vpbroadcastq_avx512vl();
      auVar9 = vpsllvq_avx2(auVar10,auVar1);
      auVar9 = vpsraq_avx512vl(auVar9,0x3f);
      auVar12 = vpermq_avx2(ZEXT1632(auVar9),0x50);
      auVar9 = vpsllvq_avx2(auVar10,auVar2);
      auVar9 = vpsraq_avx512vl(auVar9,0x3f);
      auVar4 = vpermq_avx2(ZEXT1632(auVar9),0x50);
      auVar11 = vpternlogq_avx512vl(auVar13._0_32_,auVar11,
                                    *(undefined1 (*) [32])((long)A->w64 + lVar7),0x78);
      auVar11 = vpternlogq_avx512vl(auVar11,auVar4,*(undefined1 (*) [32])((long)A[2].w64 + lVar7),
                                    0x78);
      auVar13 = ZEXT3264(auVar11);
      auVar9 = vpsllvq_avx2(auVar10,auVar3);
      auVar9 = vpsraq_avx512vl(auVar9,0x3f);
      auVar4 = vpermq_avx2(ZEXT1632(auVar9),0x50);
      auVar12 = vpternlogq_avx512vl(auVar15._0_32_,auVar12,
                                    *(undefined1 (*) [32])((long)A[1].w64 + lVar7),0x78);
      auVar12 = vpternlogq_avx512vl(auVar12,auVar4,*(undefined1 (*) [32])((long)A[3].w64 + lVar7),
                                    0x78);
      auVar15 = ZEXT3264(auVar12);
      uVar6 = uVar6 >> 8;
      lVar7 = lVar7 + 0x80;
    } while ((int)lVar7 != 0x400);
    A = A + 0x20;
    v = (mzd_local_t *)((long)v + 8);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  *(undefined1 (*) [16])c->w64 = SUB3216(auVar11 ^ auVar12,0x10) ^ SUB3216(auVar11 ^ auVar12,0);
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_s256_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word256 cval[2] = {mm256_zero, mm256_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 8, idx >>= 8, Ablock += 4) {
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
      cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask_2(idx, 4));
      cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask_2(idx, 6));
    }
  }
  cval[0] = mm256_xor(cval[0], cval[1]);
  mm128_store(
      cblock->w64,
      _mm256_extracti128_si256(
          mm256_xor(cval[0], _mm256_permute4x64_epi64(cval[0], _MM_SHUFFLE(3, 2, 3, 2))), 0));
}